

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsExecuter.cpp
# Opt level: O0

void __thiscall Refal2::COperationsExecuter::~COperationsExecuter(COperationsExecuter *this)

{
  COperationsExecuter *this_local;
  
  operator_delete(this->stack);
  CUnitList::~CUnitList(&this->fieldOfView);
  CExecutionContext::~CExecutionContext(&this->super_CExecutionContext);
  return;
}

Assistant:

COperationsExecuter::~COperationsExecuter()
{
	::operator delete( stack );
}